

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O0

void __thiscall
llava_embd_batch::llava_embd_batch
          (llava_embd_batch *this,float *embd,int32_t n_tokens,llama_pos pos_0,llama_seq_id seq_id)

{
  reference pvVar1;
  reference ppiVar2;
  int *piVar3;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *this_00;
  value_type in_R8D;
  int i;
  int local_6c;
  int local_68 [2];
  undefined8 local_60;
  undefined8 local_58;
  int *local_50;
  int *local_48;
  int **local_40;
  char *local_38;
  value_type local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x159117);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15912a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15913d);
  __new_size = in_RDI + 0x48;
  std::vector<int_*,_std::allocator<int_*>_>::vector
            ((vector<int_*,_std::allocator<int_*>_> *)0x159150);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x60);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x159163);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<int_*,_std::allocator<int_*>_>::resize
            ((vector<int_*,_std::allocator<int_*>_> *)this_00,__new_size);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),0);
  *pvVar1 = local_1c;
  ppiVar2 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                      ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 0x48),(long)local_14);
  *ppiVar2 = (value_type)0x0;
  local_68[0] = local_14;
  local_60 = 0;
  local_58 = local_10;
  local_50 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x159243);
  local_48 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x159256);
  local_40 = std::vector<int_*,_std::allocator<int_*>_>::data
                       ((vector<int_*,_std::allocator<int_*>_> *)0x159269);
  local_38 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x15927c);
  memcpy((void *)(in_RDI + 0x78),local_68,0x38);
  for (local_6c = 0; local_6c < local_14; local_6c = local_6c + 1) {
    *(int *)(*(long *)(in_RDI + 0x90) + (long)local_6c * 4) = local_18 + local_6c;
    *(undefined4 *)(*(long *)(in_RDI + 0x98) + (long)local_6c * 4) = 1;
    piVar3 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x1592ed);
    *(int **)(*(long *)(in_RDI + 0xa0) + (long)local_6c * 8) = piVar3;
    *(undefined1 *)(*(long *)(in_RDI + 0xa8) + (long)local_6c) = 0;
  }
  return;
}

Assistant:

llava_embd_batch(float * embd, int32_t n_tokens, llama_pos pos_0, llama_seq_id seq_id) {
        pos     .resize(n_tokens);
        n_seq_id.resize(n_tokens);
        seq_ids .resize(n_tokens + 1);
        logits  .resize(n_tokens);
        seq_id_0.resize(1);
        seq_id_0[0] = seq_id;
        seq_ids [n_tokens] = nullptr;
        batch = {
            /*n_tokens       =*/ n_tokens,
            /*tokens         =*/ nullptr,
            /*embd           =*/ embd,
            /*pos            =*/ pos.data(),
            /*n_seq_id       =*/ n_seq_id.data(),
            /*seq_id         =*/ seq_ids.data(),
            /*logits         =*/ logits.data(),
        };
        for (int i = 0; i < n_tokens; i++) {
            batch.pos     [i] = pos_0 + i;
            batch.n_seq_id[i] = 1;
            batch.seq_id  [i] = seq_id_0.data();
            batch.logits  [i] = false;
        }
    }